

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O3

AffixTag __thiscall
icu_63::number::impl::AffixUtils::nextToken
          (AffixUtils *this,AffixTag tag,UnicodeString *patternString,UErrorCode *status)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  UnicodeString *this_00;
  int32_t iVar6;
  undefined8 unaff_R14;
  AffixTag AVar7;
  
  this_00 = tag._8_8_;
  uVar5 = tag._0_8_;
  iVar6 = tag.offset;
  sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this_00->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if ((int)this < iVar3) {
    unaff_R14 = 0xfffffffb00000000;
    do {
      iVar3 = (int)this;
      uVar2 = UnicodeString::char32At(this_00,iVar3);
      puVar4 = (uint *)(ulong)uVar2;
      switch(uVar5 & 0xffffffff) {
      case 0:
        switch(uVar2) {
        case 0x25:
          this = (AffixUtils *)(ulong)(iVar3 + 1);
          puVar4 = (uint *)0x0;
          unaff_R14 = 0xfffffffd00000000;
          goto LAB_0025b24b;
        case 0x26:
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2c:
          goto switchD_0025b06a_caseD_26;
        case 0x27:
          this = (AffixUtils *)(ulong)(iVar3 + 1);
          uVar5 = 1;
          break;
        case 0x2b:
          this = (AffixUtils *)(ulong)(iVar3 + 1);
          puVar4 = (uint *)0x0;
          unaff_R14 = 0xfffffffe00000000;
          goto LAB_0025b24b;
        case 0x2d:
          this = (AffixUtils *)(ulong)(iVar3 + 1);
          puVar4 = (uint *)0x0;
          unaff_R14 = 0xffffffff00000000;
          goto LAB_0025b24b;
        default:
          if (uVar2 == 0xa4) {
            this = (AffixUtils *)(ulong)(iVar3 + 1);
            uVar5 = 4;
            break;
          }
          if (uVar2 == 0x2030) {
            this = (AffixUtils *)(ulong)(iVar3 + 1);
            puVar4 = (uint *)0x0;
            unaff_R14 = 0xfffffffc00000000;
            goto LAB_0025b24b;
          }
switchD_0025b06a_caseD_26:
          uVar2 = (iVar3 - (uint)(uVar2 < 0x10000)) + 2;
          goto LAB_0025b218;
        }
      case 1:
        if (uVar2 == 0x27) {
          uVar2 = iVar3 + 1;
          puVar4 = (uint *)0x27;
LAB_0025b218:
          this = (AffixUtils *)(ulong)uVar2;
          unaff_R14 = 0;
        }
        else {
LAB_0025b1d6:
          uVar2 = (iVar3 - (uint)(uVar2 < 0x10000)) + 2;
LAB_0025b1ee:
          this = (AffixUtils *)(ulong)uVar2;
          unaff_R14 = 2;
        }
        goto LAB_0025b24b;
      case 2:
        if (uVar2 != 0x27) goto LAB_0025b1d6;
        this = (AffixUtils *)(ulong)(iVar3 + 1);
        uVar5 = 3;
        break;
      case 3:
        uVar5 = 0;
        if (uVar2 == 0x27) {
          uVar2 = iVar3 + 1;
          puVar4 = (uint *)0x27;
          goto LAB_0025b1ee;
        }
        break;
      case 4:
        if (uVar2 != 0xa4) {
          puVar4 = (uint *)0x0;
          goto LAB_0025b24b;
        }
        this = (AffixUtils *)(ulong)(iVar3 + 1);
        uVar5 = 5;
        break;
      case 5:
        if (uVar2 != 0xa4) goto switchD_0025b14f_caseD_5;
        this = (AffixUtils *)(ulong)(iVar3 + 1);
        uVar5 = 6;
        break;
      case 6:
        if (uVar2 != 0xa4) goto switchD_0025b14f_caseD_6;
        this = (AffixUtils *)(ulong)(iVar3 + 1);
        uVar5 = 7;
        break;
      case 7:
        if (uVar2 != 0xa4) goto switchD_0025b14f_caseD_7;
        this = (AffixUtils *)(ulong)(iVar3 + 1);
        uVar5 = 8;
        break;
      case 8:
        if (uVar2 == 0xa4) goto LAB_0025b0fc;
        goto switchD_0025b14f_caseD_8;
      case 9:
        if (uVar2 != 0xa4) goto switchD_0025b14f_caseD_9;
LAB_0025b0fc:
        this = (AffixUtils *)(ulong)(iVar3 + 1);
        uVar5 = 9;
      }
      iVar6 = (int32_t)uVar5;
      sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (this_00->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
    } while ((int)this < iVar3);
  }
  puVar4 = &switchD_0025b14f::switchdataD_0031dbf4;
  switch(iVar6) {
  case 1:
  case 2:
    *(undefined4 *)&(patternString->super_Replaceable).super_UObject._vptr_UObject = 1;
  default:
    this = (AffixUtils *)0xffffffff;
    break;
  case 4:
    puVar4 = (uint *)0x0;
    unaff_R14 = 0xfffffffb00000000;
    break;
  case 5:
switchD_0025b14f_caseD_5:
    puVar4 = (uint *)0x0;
    unaff_R14 = 0xfffffffa00000000;
    break;
  case 6:
switchD_0025b14f_caseD_6:
    puVar4 = (uint *)0x0;
    unaff_R14 = 0xfffffff900000000;
    break;
  case 7:
switchD_0025b14f_caseD_7:
    puVar4 = (uint *)0x0;
    unaff_R14 = 0xfffffff800000000;
    break;
  case 8:
switchD_0025b14f_caseD_8:
    puVar4 = (uint *)0x0;
    unaff_R14 = 0xfffffff700000000;
    break;
  case 9:
switchD_0025b14f_caseD_9:
    puVar4 = (uint *)0x0;
    unaff_R14 = 0xfffffff100000000;
  }
LAB_0025b24b:
  uVar5 = (ulong)this & 0xffffffff | (long)puVar4 << 0x20;
  AVar7.state = (int)unaff_R14;
  AVar7.type = (int)((ulong)unaff_R14 >> 0x20);
  AVar7.offset = (int)uVar5;
  AVar7.codePoint = (int)(uVar5 >> 0x20);
  return AVar7;
}

Assistant:

AffixTag AffixUtils::nextToken(AffixTag tag, const UnicodeString &patternString, UErrorCode &status) {
    int32_t offset = tag.offset;
    int32_t state = tag.state;
    for (; offset < patternString.length();) {
        UChar32 cp = patternString.char32At(offset);
        int32_t count = U16_LENGTH(cp);

        switch (state) {
            case STATE_BASE:
                switch (cp) {
                    case u'\'':
                        state = STATE_FIRST_QUOTE;
                        offset += count;
                        // continue to the next code point
                        break;
                    case u'-':
                        return makeTag(offset + count, TYPE_MINUS_SIGN, STATE_BASE, 0);
                    case u'+':
                        return makeTag(offset + count, TYPE_PLUS_SIGN, STATE_BASE, 0);
                    case u'%':
                        return makeTag(offset + count, TYPE_PERCENT, STATE_BASE, 0);
                    case u'‰':
                        return makeTag(offset + count, TYPE_PERMILLE, STATE_BASE, 0);
                    case u'¤':
                        state = STATE_FIRST_CURR;
                        offset += count;
                        // continue to the next code point
                        break;
                    default:
                        return makeTag(offset + count, TYPE_CODEPOINT, STATE_BASE, cp);
                }
                break;
            case STATE_FIRST_QUOTE:
                if (cp == u'\'') {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_BASE, cp);
                } else {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                }
            case STATE_INSIDE_QUOTE:
                if (cp == u'\'') {
                    state = STATE_AFTER_QUOTE;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                }
            case STATE_AFTER_QUOTE:
                if (cp == u'\'') {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                } else {
                    state = STATE_BASE;
                    // re-evaluate this code point
                    break;
                }
            case STATE_FIRST_CURR:
                if (cp == u'¤') {
                    state = STATE_SECOND_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_SINGLE, STATE_BASE, 0);
                }
            case STATE_SECOND_CURR:
                if (cp == u'¤') {
                    state = STATE_THIRD_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_DOUBLE, STATE_BASE, 0);
                }
            case STATE_THIRD_CURR:
                if (cp == u'¤') {
                    state = STATE_FOURTH_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_TRIPLE, STATE_BASE, 0);
                }
            case STATE_FOURTH_CURR:
                if (cp == u'¤') {
                    state = STATE_FIFTH_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_QUAD, STATE_BASE, 0);
                }
            case STATE_FIFTH_CURR:
                if (cp == u'¤') {
                    state = STATE_OVERFLOW_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_QUINT, STATE_BASE, 0);
                }
            case STATE_OVERFLOW_CURR:
                if (cp == u'¤') {
                    offset += count;
                    // continue to the next code point and loop back to this state
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_OVERFLOW, STATE_BASE, 0);
                }
            default:
                U_ASSERT(false);
        }
    }
    // End of string
    switch (state) {
        case STATE_BASE:
            // No more tokens in string.
            return {-1};
        case STATE_FIRST_QUOTE:
        case STATE_INSIDE_QUOTE:
            // For consistent behavior with the JDK and ICU 58, set an error here.
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return {-1};
        case STATE_AFTER_QUOTE:
            // No more tokens in string.
            return {-1};
        case STATE_FIRST_CURR:
            return makeTag(offset, TYPE_CURRENCY_SINGLE, STATE_BASE, 0);
        case STATE_SECOND_CURR:
            return makeTag(offset, TYPE_CURRENCY_DOUBLE, STATE_BASE, 0);
        case STATE_THIRD_CURR:
            return makeTag(offset, TYPE_CURRENCY_TRIPLE, STATE_BASE, 0);
        case STATE_FOURTH_CURR:
            return makeTag(offset, TYPE_CURRENCY_QUAD, STATE_BASE, 0);
        case STATE_FIFTH_CURR:
            return makeTag(offset, TYPE_CURRENCY_QUINT, STATE_BASE, 0);
        case STATE_OVERFLOW_CURR:
            return makeTag(offset, TYPE_CURRENCY_OVERFLOW, STATE_BASE, 0);
        default:
            U_ASSERT(false);
            return {-1}; // suppress "control reaches end of non-void function"
    }
}